

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dense.hpp
# Opt level: O3

void __thiscall
Disa::Vector_Dense<double,_3UL>::Vector_Dense
          (Vector_Dense<double,_3UL> *this,function<double_(unsigned_long)> *lambda,size_t size)

{
  ostream *poVar1;
  source_location *in_RCX;
  char *pcVar2;
  double dVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  undefined **local_28;
  
  if (size == 3) {
    pcVar2 = (char *)0x0;
    while (local_48._M_dataplus._M_p = pcVar2,
          (lambda->super__Function_base)._M_manager != (_Manager_type)0x0) {
      dVar3 = (*lambda->_M_invoker)((_Any_data *)lambda,(unsigned_long *)&local_48);
      (this->super_array<double,_3UL>)._M_elems[(long)pcVar2] = dVar3;
      pcVar2 = pcVar2 + 1;
      if (pcVar2 == (char *)0x3) {
        return;
      }
    }
    std::__throw_bad_function_call();
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
  local_28 = &PTR_s__workspace_llm4binary_github_lic_00162890;
  console_format_abi_cxx11_(&local_48,(Disa *)0x0,(Log_Level)&local_28,in_RCX);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,local_48._M_dataplus._M_p,local_48._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"Cannot change the size for a static vector.",0x2b);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_48);
  exit(1);
}

Assistant:

explicit Vector_Dense(const std::function<_type(const std::size_t)>& lambda, std::size_t size = _size) {
    ASSERT_DEBUG(size == _size, "Cannot change the size for a static vector.");
    FOR(i_element, this->size())(*this)[i_element] = lambda(i_element);
  }